

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  ArenaImpl *this_00;
  uint uVar1;
  string *psVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = length;
  if (already_allocated < length) {
    uVar1 = already_allocated;
  }
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)our_elems[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (already_allocated < length) {
    this_00 = (ArenaImpl *)this->arena_;
    lVar3 = 0;
    do {
      if (this_00 == (ArenaImpl *)0x0) {
        psVar2 = (string *)operator_new(0x20);
      }
      else {
        if ((this_00->lifecycle_id_ & 1) != 0) {
          MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    ((RepeatedPtrFieldBase *)&this_00->options_);
        }
        psVar2 = (string *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (this_00,0x20,arena_destruct_object<std::__cxx11::string>);
      }
      *(string **)psVar2 = psVar2 + 0x10;
      *(undefined8 *)(psVar2 + 8) = 0;
      psVar2[0x10] = (string)0x0;
      std::__cxx11::string::_M_assign(psVar2);
      our_elems[already_allocated + lVar3] = psVar2;
      lVar3 = lVar3 + 1;
    } while (length - already_allocated != (int)lVar3);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArena();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}